

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalSubtyping.cpp
# Opt level: O0

void __thiscall
wasm::LocalSubtyping::doWalkFunction(wasm::Function*)::Scanner::visitLocalSet(wasm::LocalSet__
          (void *this,LocalSet *curr)

{
  bool bVar1;
  reference this_00;
  reference local_28;
  LocalSet *local_18;
  LocalSet *curr_local;
  Scanner *this_local;
  
  local_18 = curr;
  curr_local = (LocalSet *)this;
  local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)((long)this + 0xd8),
                        (ulong)curr->index);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_28);
  if (bVar1) {
    this_00 = std::
              vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
              ::operator[]((vector<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
                            *)((long)this + 0x100),(ulong)local_18->index);
    std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back(this_00,&local_18);
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        if (relevant[curr->index]) {
          setsForLocal[curr->index].push_back(curr);
        }
      }